

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                 (string *s,char *ptr,ParseContext *ctx,char *field_name)

{
  char *pcVar1;
  char *field_name_00;
  StringPiece str;
  StringPiece local_30;
  
  field_name_00 = field_name;
  pcVar1 = InlineGreedyStringParser(s,ptr,ctx);
  StringPiece::StringPiece<std::allocator<char>>(&local_30,s);
  str.length_ = (stringpiece_ssize_type)field_name;
  str.ptr_ = (char *)local_30.length_;
  VerifyUTF8((internal *)local_30.ptr_,str,field_name_00);
  return pcVar1;
}

Assistant:

inline PROTOBUF_MUST_USE_RESULT const char* InlineGreedyStringParserUTF8Verify(
    std::string* s, const char* ptr, ParseContext* ctx,
    const char* field_name) {
  auto p = InlineGreedyStringParser(s, ptr, ctx);
#ifndef NDEBUG
  VerifyUTF8(*s, field_name);
#else   // !NDEBUG
  (void)field_name;
#endif  // !NDEBUG
  return p;
}